

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O0

fasttext_args_t * cft_fasttext_get_args(fasttext_t *handle)

{
  Args *this;
  Args *new_args;
  Args args;
  stringstream ss;
  FastText *x;
  istream *in_stack_fffffffffffffca8;
  Args *in_stack_fffffffffffffcb0;
  FastText *in_stack_fffffffffffffcb8;
  Args *in_stack_fffffffffffffd00;
  stringstream local_198 [408];
  
  std::__cxx11::stringstream::stringstream(local_198);
  fasttext::FastText::getArgs(in_stack_fffffffffffffcb8);
  fasttext::Args::save(in_stack_fffffffffffffcb0,(ostream *)in_stack_fffffffffffffca8);
  this = (Args *)operator_new(400);
  fasttext::Args::Args(in_stack_fffffffffffffd00);
  fasttext::Args::load(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
  fasttext::Args::~Args(this);
  std::__cxx11::stringstream::~stringstream(local_198);
  return (fasttext_args_t *)this;
}

Assistant:

fasttext_args_t* cft_fasttext_get_args(fasttext_t* handle) {
    FastText* x = (FastText*)handle;
    std::stringstream ss;
    Args args = x->getArgs();
    args.save(ss);
    Args* new_args = new Args();
    new_args->load(ss);
    return (fasttext_args_t*)new_args;
}